

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void __thiscall cmCursesMainForm::HandleInput(cmCursesMainForm *this)

{
  short sVar1;
  size_type sVar2;
  cmState *pcVar3;
  cmCursesCacheEntryComposite *pcVar4;
  undefined8 __n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *messages;
  char cVar5;
  _Bool _Var6;
  FIELD *pFVar7;
  long *plVar8;
  long lVar9;
  cmCursesLongMessageForm *pcVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  char *__s;
  long *plVar14;
  FIELD **ppFVar15;
  pointer ppcVar16;
  int iVar17;
  uint uVar18;
  FORM *pFVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer ppcVar20;
  uint uVar21;
  string searchstr;
  int key;
  char debugMessage [128];
  FIELD *local_140;
  undefined1 local_138 [32];
  uint local_118;
  allocator local_111;
  pointer local_110;
  FIELD *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  string local_f8;
  size_t local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d0;
  string *local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c0;
  char local_b8 [136];
  
  if ((this->super_cmCursesForm).Form != (FORM *)0x0) {
    local_100 = &this->SearchString;
    local_c8 = (string *)&this->OldSearchString;
    local_d0 = &this->Errors;
    local_c0 = &this->HelpMessage;
    uVar21 = 0;
    __rhs = local_100;
LAB_0022851b:
    do {
      (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
      PrintKeys(this,0);
      if (this->SearchMode == true) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"Search: ",__rhs);
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,local_138._0_8_);
        PrintKeys(this,1);
        move(uVar21 - 5);
        if (_stdscr == 0) {
          iVar17 = -1;
        }
        else {
          iVar17 = *(short *)(_stdscr + 4) + 1;
        }
        wtouchln(_stdscr,0,iVar17,1);
        refresh();
        if ((FIELD *)local_138._0_8_ != (FIELD *)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_,CONCAT71(local_138._17_7_,local_138[0x10]) + 1);
        }
      }
      local_118 = wgetch(_stdscr);
      if (_stdscr != 0) {
        sVar1 = *(short *)(_stdscr + 6);
        uVar21 = (int)*(short *)(_stdscr + 4) + 1;
        if (*(short *)(_stdscr + 4) < 5 || sVar1 < 0x40) goto LAB_0022866f;
        pFVar7 = current_field((this->super_cmCursesForm).Form);
        plVar8 = (long *)field_userptr(pFVar7);
        if (this->SearchMode != true) {
          if ((plVar8 == (long *)0x0) ||
             (cVar5 = (**(code **)(*plVar8 + 0x10))(plVar8,&local_118,this,_stdscr), cVar5 == '\0'))
          goto LAB_00228715;
          this->OkToGenerate = false;
          (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
          PrintKeys(this,0);
          goto switchD_0022877d_caseD_65;
        }
        if ((local_118 == 0x157) || (local_118 == 10)) {
          this->SearchMode = false;
          if ((this->SearchString)._M_string_length == 0) {
            pcVar11 = (char *)0x0;
          }
          else {
            JumpToCacheEntry(this,(this->SearchString)._M_dataplus._M_p);
            std::__cxx11::string::_M_assign(local_c8);
            pcVar11 = (char *)(this->SearchString)._M_string_length;
          }
          std::__cxx11::string::_M_replace((ulong)__rhs,0,pcVar11,0x50caef);
        }
        else if (((local_118 & 0xffffffdf) - 0x41 < 0x1a) ||
                (local_118 == 0x5f || local_118 - 0x30 < 10)) {
          if ((this->SearchString)._M_string_length < (ulong)(ushort)(sVar1 - 9)) {
            std::__cxx11::string::push_back((char)__rhs);
          }
        }
        else if ((((local_118 == 8) || (local_118 == 0x14a)) || (local_118 == 0x107)) &&
                (sVar2 = (this->SearchString)._M_string_length, sVar2 != 0)) {
          std::__cxx11::string::resize((ulong)__rhs,(char)sVar2 + -1);
        }
LAB_00228715:
        if (this->SearchMode != false) goto switchD_0022877d_caseD_65;
        sprintf(local_b8,"Main form handling input, key: %d",(ulong)local_118);
        cmCursesForm::LogMessage(local_b8);
        messages = local_c0;
        if (0x62 < (int)local_118) {
          if ((int)local_118 < 0x102) {
            switch(local_118) {
            case 99:
              Configure(this,0);
              break;
            case 100:
              if (this->NumberOfVisibleEntries != 0) {
                this->OkToGenerate = false;
                pFVar7 = current_field((this->super_cmCursesForm).Form);
                iVar17 = field_index(pFVar7);
                lVar9 = (long)iVar17;
                if (iVar17 == 2) {
                  ppFVar15 = this->Fields;
                  local_140 = (FIELD *)0x0;
                }
                else {
                  ppFVar15 = this->Fields;
                  if (this->NumberOfVisibleEntries * 3 + -1 == lVar9) {
                    local_140 = ppFVar15[lVar9 + -5];
                  }
                  else {
                    local_140 = ppFVar15[lVar9 + 1];
                  }
                }
                plVar8 = (long *)field_userptr(ppFVar15[lVar9 + -2]);
                if (plVar8 != (long *)0x0) {
                  pcVar3 = this->CMakeInstance->State;
                  pcVar11 = (char *)(**(code **)(*plVar8 + 0x28))(plVar8);
                  std::__cxx11::string::string((string *)local_138,pcVar11,(allocator *)&local_f8);
                  cmState::RemoveCacheEntry(pcVar3,(string *)local_138);
                  if ((FIELD *)local_138._0_8_ != (FIELD *)(local_138 + 0x10)) {
                    operator_delete((void *)local_138._0_8_,
                                    CONCAT71(local_138._17_7_,local_138[0x10]) + 1);
                  }
                  local_138._0_8_ = local_138 + 0x10;
                  local_138._8_8_ = 0;
                  local_138[0x10] = '\0';
                  if (local_140 != (FIELD *)0x0) {
                    plVar14 = (long *)field_userptr(local_140);
                    pcVar11 = (char *)(**(code **)(*plVar14 + 0x28))(plVar14);
                    std::__cxx11::string::operator=((string *)local_138,pcVar11);
                  }
                  if (_stdscr == 0) {
                    uVar21 = 0xffffffff;
                    uVar18 = 0xffffffff;
                  }
                  else {
                    uVar21 = (int)*(short *)(_stdscr + 4) + 1;
                    uVar18 = (int)*(short *)(_stdscr + 6) + 1;
                  }
                  pcVar11 = (char *)(**(code **)(*plVar8 + 0x28))(plVar8);
                  RemoveEntry(this,pcVar11);
                  RePost(this);
                  (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                            (this,1,1,(ulong)uVar18,(ulong)uVar21);
                  __n = local_138._8_8_;
                  if (local_140 != (FIELD *)0x0) {
                    ppcVar20 = (this->Entries->
                               super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                    ppcVar16 = (this->Entries->
                               super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    if (ppcVar20 != ppcVar16) {
                      local_108 = (FIELD *)local_138._0_8_;
                      local_140 = (FIELD *)0x0;
                      local_110 = ppcVar16;
                      do {
                        pcVar4 = *ppcVar20;
                        if ((__n == (pcVar4->Key)._M_string_length) &&
                           ((__n == 0 ||
                            (iVar17 = bcmp(local_108,(pcVar4->Key)._M_dataplus._M_p,__n),
                            ppcVar16 = local_110, iVar17 == 0)))) {
                          local_140 = pcVar4->Entry->Field;
                        }
                        ppcVar20 = ppcVar20 + 1;
                      } while (ppcVar20 != ppcVar16);
                      if (local_140 != (FIELD *)0x0) {
                        set_current_field((this->super_cmCursesForm).Form,local_140);
                      }
                    }
                  }
                  if ((FIELD *)local_138._0_8_ != (FIELD *)(local_138 + 0x10)) {
                    operator_delete((void *)local_138._0_8_,
                                    CONCAT71(local_138._17_7_,local_138[0x10]) + 1);
                  }
                }
              }
              break;
            case 0x67:
              if (this->OkToGenerate == true) {
                Generate(this);
                return;
              }
              break;
            case 0x68:
              if (_stdscr == 0) {
                uVar21 = 0xffffffff;
                local_110 = (pointer)CONCAT44(local_110._4_4_,0xffffffff);
              }
              else {
                uVar21 = (int)*(short *)(_stdscr + 4) + 1;
                local_110 = (pointer)CONCAT44(local_110._4_4_,*(short *)(_stdscr + 6) + 1);
              }
              local_108 = current_field((this->super_cmCursesForm).Form);
              iVar17 = field_index(local_108);
              plVar8 = (long *)field_userptr(this->Fields[(long)iVar17 + -2]);
              pcVar11 = (char *)(**(code **)(*plVar8 + 0x28))(plVar8);
              pcVar3 = this->CMakeInstance->State;
              std::__cxx11::string::string((string *)local_138,pcVar11,(allocator *)&local_f8);
              pcVar12 = cmState::GetCacheEntryValue(pcVar3,(string *)local_138);
              if ((FIELD *)local_138._0_8_ != (FIELD *)(local_138 + 0x10)) {
                operator_delete((void *)local_138._0_8_,
                                CONCAT71(local_138._17_7_,local_138[0x10]) + 1);
              }
              if (pcVar12 == (char *)0x0) {
LAB_00228c24:
                std::__cxx11::string::operator=
                          ((string *)
                           ((messages->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1),"");
              }
              else {
                pcVar3 = this->CMakeInstance->State;
                std::__cxx11::string::string((string *)local_138,pcVar11,&local_111);
                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"HELPSTRING","")
                ;
                pcVar12 = cmState::GetCacheEntryProperty(pcVar3,(string *)local_138,&local_f8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
                if ((FIELD *)local_138._0_8_ != (FIELD *)(local_138 + 0x10)) {
                  operator_delete((void *)local_138._0_8_,
                                  CONCAT71(local_138._17_7_,local_138[0x10]) + 1);
                }
                if (pcVar12 == (char *)0x0) goto LAB_00228c24;
                local_d8 = strlen(pcVar11);
                sVar13 = strlen(pcVar12);
                __s = (char *)operator_new__(local_d8 + 0x40 + sVar13);
                sprintf(__s,"Current option is: %s\nHelp string for this option is: %s\n",pcVar11,
                        pcVar12);
                std::__cxx11::string::operator=
                          ((string *)
                           ((messages->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1),__s);
                operator_delete__(__s);
              }
              pcVar10 = (cmCursesLongMessageForm *)operator_new(0x60);
              cmCursesLongMessageForm::cmCursesLongMessageForm(pcVar10,messages,"Help.");
              ppcVar20 = local_110;
              cmCursesForm::CurrentForm = (cmCursesForm *)pcVar10;
              (*(pcVar10->super_cmCursesForm)._vptr_cmCursesForm[3])
                        (pcVar10,1,1,(ulong)local_110 & 0xffffffff,(ulong)uVar21);
              (*(pcVar10->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar10);
              cmCursesForm::CurrentForm = &this->super_cmCursesForm;
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                        (this,1,1,(ulong)ppcVar20 & 0xffffffff,(ulong)uVar21);
              pFVar19 = (this->super_cmCursesForm).Form;
              pFVar7 = local_108;
LAB_00228caf:
              set_current_field(pFVar19,pFVar7);
              break;
            case 0x6c:
              if (_stdscr == 0) {
                uVar21 = 0xffffffff;
                uVar18 = 0xffffffff;
              }
              else {
                uVar21 = (int)*(short *)(_stdscr + 4) + 1;
                uVar18 = (int)*(short *)(_stdscr + 6) + 1;
              }
              pcVar10 = (cmCursesLongMessageForm *)operator_new(0x60);
              cmCursesLongMessageForm::cmCursesLongMessageForm
                        (pcVar10,local_d0,"Errors occurred during the last pass.");
              cmCursesForm::CurrentForm = (cmCursesForm *)pcVar10;
              (*(pcVar10->super_cmCursesForm)._vptr_cmCursesForm[3])
                        (pcVar10,1,1,(ulong)uVar18,(ulong)uVar21);
              (*(pcVar10->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar10);
              cmCursesForm::CurrentForm = &this->super_cmCursesForm;
              goto LAB_00228a75;
            case 0x6e:
              if ((this->OldSearchString)._M_string_length != 0) {
                JumpToCacheEntry(this,(this->OldSearchString)._M_dataplus._M_p);
              }
              break;
            case 0x71:
              goto switchD_0022877d_caseD_71;
            case 0x74:
              this->AdvancedMode = (bool)(this->AdvancedMode ^ 1);
              if (_stdscr == 0) {
                uVar21 = 0xffffffff;
                uVar18 = 0xffffffff;
              }
              else {
                uVar21 = (int)*(short *)(_stdscr + 4) + 1;
                uVar18 = (int)*(short *)(_stdscr + 6) + 1;
              }
              RePost(this);
LAB_00228a75:
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                        (this,1,1,(ulong)uVar18,(ulong)uVar21);
            }
          }
          else {
            if ((int)local_118 < 0x152) {
              if (local_118 != 0x102) {
                if (local_118 == 0x103) goto LAB_00228807;
                goto switchD_0022877d_caseD_65;
              }
LAB_00228868:
              pFVar7 = current_field((this->super_cmCursesForm).Form);
              iVar17 = field_index(pFVar7);
              __rhs = local_100;
              if (this->NumberOfVisibleEntries * 3 + -1 != (long)iVar17) {
                _Var6 = new_page(this->Fields[(long)iVar17 + 1]);
                pFVar19 = (this->super_cmCursesForm).Form;
                if (!_Var6) {
                  iVar17 = 0x204;
                  goto LAB_002288d5;
                }
                goto LAB_002288d0;
              }
              goto LAB_0022851b;
            }
            if (local_118 == 0x152) goto LAB_002288cc;
            if (local_118 == 0x153) goto LAB_002288c1;
          }
switchD_0022877d_caseD_65:
          if (_stdscr == 0) {
            iVar17 = -1;
          }
          else {
            iVar17 = *(short *)(_stdscr + 4) + 1;
          }
          wtouchln(_stdscr,0,iVar17,1);
          wrefresh(_stdscr);
          __rhs = local_100;
          goto LAB_0022851b;
        }
        if ((int)local_118 < 0x10) {
          if (local_118 != 4) {
            if (local_118 == 0xe) goto LAB_00228868;
            goto switchD_0022877d_caseD_65;
          }
LAB_002288cc:
          pFVar19 = (this->super_cmCursesForm).Form;
LAB_002288d0:
          iVar17 = 0x200;
        }
        else if (local_118 == 0x10) {
LAB_00228807:
          pFVar7 = current_field((this->super_cmCursesForm).Form);
          iVar17 = field_index(pFVar7);
          __rhs = local_100;
          if (iVar17 == 2) goto LAB_0022851b;
          _Var6 = new_page(this->Fields[(long)iVar17 + -2]);
          pFVar19 = (this->super_cmCursesForm).Form;
          if (_Var6) {
            form_driver(pFVar19,0x201);
            pFVar19 = (this->super_cmCursesForm).Form;
            pFVar7 = this->Fields[(long)iVar17 + -3];
            goto LAB_00228caf;
          }
          iVar17 = 0x205;
        }
        else {
          if (local_118 != 0x15) {
            if (local_118 == 0x2f) {
              this->SearchMode = true;
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,"Search");
              PrintKeys(this,1);
              if (_stdscr == 0) {
                iVar17 = -1;
              }
              else {
                iVar17 = *(short *)(_stdscr + 4) + 1;
              }
              wtouchln(_stdscr,0,iVar17,1);
              refresh();
            }
            goto switchD_0022877d_caseD_65;
          }
LAB_002288c1:
          pFVar19 = (this->super_cmCursesForm).Form;
          iVar17 = 0x201;
        }
LAB_002288d5:
        form_driver(pFVar19,iVar17);
        goto switchD_0022877d_caseD_65;
      }
      uVar21 = 0xffffffff;
LAB_0022866f:
    } while (local_118 != 0x71);
  }
switchD_0022877d_caseD_71:
  return;
}

Assistant:

void cmCursesMainForm::HandleInput()
{
  int x=0,y=0;

  if (!this->Form)
    {
    return;
    }

  FIELD* currentField;
  cmCursesWidget* currentWidget;

  char debugMessage[128];

  for(;;)
    {
    this->UpdateStatusBar();
    this->PrintKeys();
    if ( this->SearchMode )
      {
      std::string searchstr = "Search: " + this->SearchString;
      this->UpdateStatusBar( searchstr.c_str() );
      this->PrintKeys(1);
      curses_move(y-5,static_cast<unsigned int>(searchstr.size()));
      //curses_move(1,1);
      touchwin(stdscr);
      refresh();
      }
    int key = getch();

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if ( x < cmCursesMainForm::MIN_WIDTH  ||
         y < cmCursesMainForm::MIN_HEIGHT )
      {
      // quit
      if ( key == 'q' )
        {
        break;
        }
      else
        {
        continue;
        }
      }

    currentField = current_field(this->Form);
    currentWidget = reinterpret_cast<cmCursesWidget*>(field_userptr(
      currentField));

    bool widgetHandled=false;

    if ( this->SearchMode )
      {
      if ( key == 10 || key == KEY_ENTER )
        {
        this->SearchMode = false;
        if (!this->SearchString.empty())
          {
          this->JumpToCacheEntry(this->SearchString.c_str());
          this->OldSearchString = this->SearchString;
          }
        this->SearchString = "";
        }
      /*
      else if ( key == KEY_ESCAPE )
        {
        this->SearchMode = false;
        }
      */
      else if ((key >= 'a' && key <= 'z') ||
               (key >= 'A' && key <= 'Z') ||
               (key >= '0' && key <= '9') ||
               (key == '_' ))
        {
        if ( this->SearchString.size() < static_cast<std::string::size_type>(x-10) )
          {
          this->SearchString += static_cast<char>(key);
          }
        }
      else if ( key == ctrl('h') || key == KEY_BACKSPACE || key == KEY_DC )
        {
        if (!this->SearchString.empty())
          {
          this->SearchString.resize(this->SearchString.size()-1);
          }
        }
      }
    else if (currentWidget && !this->SearchMode)
      {
      // Ask the current widget if it wants to handle input
      widgetHandled = currentWidget->HandleInput(key, this, stdscr);
      if (widgetHandled)
        {
        this->OkToGenerate = false;
        this->UpdateStatusBar();
        this->PrintKeys();
        }
      }
    if ((!currentWidget || !widgetHandled) && !this->SearchMode)
      {
      // If the current widget does not want to handle input,
      // we handle it.
      sprintf(debugMessage, "Main form handling input, key: %d", key);
      cmCursesForm::LogMessage(debugMessage);
      // quit
      if ( key == 'q' )
        {
        break;
        }
      // if not end of page, next field otherwise next page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      else if ( key == KEY_DOWN || key == ctrl('n') )
        {
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);
        if ( findex == 3*this->NumberOfVisibleEntries-1 )
          {
          continue;
          }
        if (new_page(this->Fields[findex+1]))
          {
          form_driver(this->Form, REQ_NEXT_PAGE);
          }
        else
          {
          form_driver(this->Form, REQ_NEXT_FIELD);
          }
        }
      // if not beginning of page, previous field, otherwise previous page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      else if ( key == KEY_UP || key == ctrl('p') )
        {
        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        if ( findex == 2 )
          {
          continue;
          }
        if ( new_page(this->Fields[findex-2]) )
          {
          form_driver(this->Form, REQ_PREV_PAGE);
          set_current_field(this->Form, this->Fields[findex-3]);
          }
        else
          {
          form_driver(this->Form, REQ_PREV_FIELD);
          }
        }
      // pg down
      else if ( key == KEY_NPAGE || key == ctrl('d') )
        {
        form_driver(this->Form, REQ_NEXT_PAGE);
        }
      // pg up
      else if ( key == KEY_PPAGE || key == ctrl('u') )
        {
        form_driver(this->Form, REQ_PREV_PAGE);
        }
      // configure
      else if ( key == 'c' )
        {
        this->Configure();
        }
      // display help
      else if ( key == 'h' )
        {
        getmaxyx(stdscr, y, x);

        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(field_userptr(
          this->Fields[findex-2]));
        const char* curField = lbl->GetValue();
        const char* helpString = 0;

        const char* existingValue =
            this->CMakeInstance->GetState()
                ->GetCacheEntryValue(curField);
        if (existingValue)
          {
          helpString = this->CMakeInstance->GetState()
                           ->GetCacheEntryProperty(curField, "HELPSTRING");
          }
        if (helpString)
          {
          char* message = new char[strlen(curField)+strlen(helpString)
                                  +strlen("Current option is: \n Help string for this option is: \n")+10];
          sprintf(message,"Current option is: %s\nHelp string for this option is: %s\n", curField, helpString);
          this->HelpMessage[1] = message;
          delete[] message;
          }
        else
          {
          this->HelpMessage[1] = "";
          }

        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(this->HelpMessage,
                                                                    "Help.");
        CurrentForm = msgs;
        msgs->Render(1,1,x,y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1,1,x,y);
        set_current_field(this->Form, cur);
        }
      // display last errors
      else if ( key == 'l' )
        {
        getmaxyx(stdscr, y, x);
        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(this->Errors,
                                                                    "Errors occurred during the last pass.");
        CurrentForm = msgs;
        msgs->Render(1,1,x,y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1,1,x,y);
        }
      else if ( key == '/' )
        {
        this->SearchMode = true;
        this->UpdateStatusBar("Search");
        this->PrintKeys(1);
        touchwin(stdscr);
        refresh();
        }
      else if ( key == 'n' )
        {
        if (!this->OldSearchString.empty())
          {
          this->JumpToCacheEntry(this->OldSearchString.c_str());
          }
        }
      // switch advanced on/off
      else if ( key == 't' )
        {
        if (this->AdvancedMode)
          {
          this->AdvancedMode = false;
          }
        else
          {
          this->AdvancedMode = true;
          }
        getmaxyx(stdscr, y, x);
        this->RePost();
        this->Render(1, 1, x, y);
        }
      // generate and exit
      else if ( key == 'g' )
        {
        if ( this->OkToGenerate )
          {
          this->Generate();
          break;
          }
        }
      // delete cache entry
      else if ( key == 'd' && this->NumberOfVisibleEntries )
        {
        this->OkToGenerate = false;
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);

        // make the next or prev. current field after deletion
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the prev. entry is findex-5
        // and the label field for the next entry is findex+1
        // (findex always corresponds to the value field)
        FIELD* nextCur;
        if ( findex == 2 )
          {
          nextCur=0;
          }
        else if ( findex == 3*this->NumberOfVisibleEntries-1 )
          {
          nextCur = this->Fields[findex-5];
          }
        else
          {
          nextCur = this->Fields[findex+1];
          }

        // Get the label widget
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the is findex-2
        // (findex always corresponds to the value field)
        cmCursesWidget* lbl
          = reinterpret_cast<cmCursesWidget*>(
            field_userptr(this->Fields[findex-2]));
        if ( lbl )
          {
          this->CMakeInstance->GetState()->RemoveCacheEntry(lbl->GetValue());

          std::string nextVal;
          if (nextCur)
            {
            nextVal = (reinterpret_cast<cmCursesWidget*>(field_userptr(nextCur))->GetValue());
            }

          getmaxyx(stdscr, y, x);
          this->RemoveEntry(lbl->GetValue());
          this->RePost();
          this->Render(1, 1, x, y);

          if (nextCur)
            {
            // make the next or prev. current field after deletion
            nextCur = 0;
            std::vector<cmCursesCacheEntryComposite*>::iterator it;
            for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
              {
              if (nextVal == (*it)->Key)
                {
                nextCur = (*it)->Entry->Field;
                }
              }

            if (nextCur)
              {
              set_current_field(this->Form, nextCur);
              }
            }
          }
        }
      }

    touchwin(stdscr);
    wrefresh(stdscr);
    }
}